

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

bool __thiscall GlobOptBlockData::IsSwitchInt32TypeSpecialized(GlobOptBlockData *this,Instr *instr)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  
  bVar2 = GlobOpt::IsSwitchOptEnabledForIntTypeSpec(instr->m_func->topFunc);
  if (bVar2) {
    OVar3 = IR::Opnd::GetKind(instr->m_src1);
    if (OVar3 == OpndKindReg) {
      this_00 = instr->m_src1;
      OVar3 = IR::Opnd::GetKind(this_00);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      bVar2 = IsInt32TypeSpecialized(this,(Sym *)this_00[1]._vptr_Opnd);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool
GlobOptBlockData::IsSwitchInt32TypeSpecialized(IR::Instr const * instr) const
{
    return GlobOpt::IsSwitchOptEnabledForIntTypeSpec(instr->m_func->GetTopFunc())
        && instr->GetSrc1()->IsRegOpnd()
        && this->IsInt32TypeSpecialized(instr->GetSrc1()->AsRegOpnd()->m_sym);
}